

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcp_cache_server.cpp
# Opt level: O0

void __thiscall cppcms::impl::tcp_cache_service::session::run(session *this)

{
  callback<void_(const_std::error_code_&,_unsigned_long)> *in_RDI;
  mutable_buffer *this_00;
  size_t in_stack_ffffffffffffffa0;
  shared_ptr<cppcms::impl::tcp_cache_service::session> *in_stack_ffffffffffffffa8;
  offset_in_session_to_subr in_stack_ffffffffffffffb0;
  callback local_38 [56];
  
  this_00 = (mutable_buffer *)(in_RDI + 0x13);
  booster::aio::buffer(in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0);
  std::enable_shared_from_this<cppcms::impl::tcp_cache_service::session>::shared_from_this
            ((enable_shared_from_this<cppcms::impl::tcp_cache_service::session> *)this_00);
  mfunc_to_io_handler<cppcms::impl::tcp_cache_service::session,std::shared_ptr<cppcms::impl::tcp_cache_service::session>>
            (in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
  booster::callback<void(std::error_code_const&,unsigned_long)>::
  callback<booster::callable<void(std::error_code_const&,unsigned_long)>>
            (in_RDI,(intrusive_ptr<booster::callable<void_(const_std::error_code_&,_unsigned_long)>_>
                     *)this_00);
  booster::aio::stream_socket::async_read(this_00,local_38);
  booster::callback<void_(const_std::error_code_&,_unsigned_long)>::~callback
            ((callback<void_(const_std::error_code_&,_unsigned_long)> *)0x484a2d);
  booster::intrusive_ptr<booster::callable<void_(const_std::error_code_&,_unsigned_long)>_>::
  ~intrusive_ptr(&in_RDI->call_ptr);
  std::shared_ptr<cppcms::impl::tcp_cache_service::session>::~shared_ptr
            ((shared_ptr<cppcms::impl::tcp_cache_service::session> *)0x484a41);
  booster::aio::mutable_buffer::~mutable_buffer((mutable_buffer *)0x484a4b);
  return;
}

Assistant:

void run()
	{
		socket_.async_read(io::buffer(&hin_,sizeof(hin_)),
				mfunc_to_io_handler(&session::on_header_in,shared_from_this()));
	}